

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

PointLight * __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
new_object<pbrt::PointLight,pbrt::Transform&,pbrt::MediumHandle&,pbrt::SpectrumHandle&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,Transform *args,MediumHandle *args_1,
          SpectrumHandle *args_2,float *args_3,polymorphic_allocator<std::byte> *args_4)

{
  Float FVar1;
  uintptr_t uVar2;
  Allocator alloc;
  int iVar3;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  PointLight *pPVar4;
  
  iVar3 = (*this->memoryResource->_vptr_memory_resource[2])(this->memoryResource,200,8);
  pPVar4 = (PointLight *)CONCAT44(extraout_var,iVar3);
  local_b8 = *(undefined8 *)(args->m).m[0];
  uStack_b0 = *(undefined8 *)((args->m).m[0] + 2);
  uStack_a8 = *(undefined8 *)(args->m).m[1];
  uStack_a0 = *(undefined8 *)((args->m).m[1] + 2);
  uStack_98 = *(undefined8 *)(args->m).m[2];
  uStack_90 = *(undefined8 *)((args->m).m[2] + 2);
  uStack_88 = *(undefined8 *)(args->m).m[3];
  uStack_80 = *(undefined8 *)((args->m).m[3] + 2);
  local_78 = *(undefined8 *)(args->mInv).m[0];
  uStack_70 = *(undefined8 *)((args->mInv).m[0] + 2);
  uStack_68 = *(undefined8 *)(args->mInv).m[1];
  uStack_60 = *(undefined8 *)((args->mInv).m[1] + 2);
  uStack_58 = *(undefined8 *)(args->mInv).m[2];
  uStack_50 = *(undefined8 *)((args->mInv).m[2] + 2);
  uStack_48 = *(undefined8 *)(args->mInv).m[3];
  uStack_40 = *(undefined8 *)((args->mInv).m[3] + 2);
  FVar1 = *args_3;
  uVar2 = (args_1->
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          ).bits;
  local_c0.bits =
       (args_2->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  alloc.memoryResource = args_4->memoryResource;
  (pPVar4->super_LightBase).type = DeltaPosition;
  *(undefined8 *)(pPVar4->super_LightBase).renderFromLight.m.m[0] = local_b8;
  *(undefined8 *)((pPVar4->super_LightBase).renderFromLight.m.m[0] + 2) = uStack_b0;
  *(undefined8 *)(pPVar4->super_LightBase).renderFromLight.m.m[1] = uStack_a8;
  *(undefined8 *)((pPVar4->super_LightBase).renderFromLight.m.m[1] + 2) = uStack_a0;
  *(undefined8 *)(pPVar4->super_LightBase).renderFromLight.m.m[2] = uStack_98;
  *(undefined8 *)((pPVar4->super_LightBase).renderFromLight.m.m[2] + 2) = uStack_90;
  *(undefined8 *)(pPVar4->super_LightBase).renderFromLight.m.m[3] = uStack_88;
  *(undefined8 *)((pPVar4->super_LightBase).renderFromLight.m.m[3] + 2) = uStack_80;
  *(undefined8 *)(pPVar4->super_LightBase).renderFromLight.mInv.m[0] = local_78;
  *(undefined8 *)((pPVar4->super_LightBase).renderFromLight.mInv.m[0] + 2) = uStack_70;
  *(undefined8 *)(pPVar4->super_LightBase).renderFromLight.mInv.m[1] = uStack_68;
  *(undefined8 *)((pPVar4->super_LightBase).renderFromLight.mInv.m[1] + 2) = uStack_60;
  *(undefined8 *)(pPVar4->super_LightBase).renderFromLight.mInv.m[2] = uStack_58;
  *(undefined8 *)((pPVar4->super_LightBase).renderFromLight.mInv.m[2] + 2) = uStack_50;
  *(undefined8 *)(pPVar4->super_LightBase).renderFromLight.mInv.m[3] = uStack_48;
  *(undefined8 *)((pPVar4->super_LightBase).renderFromLight.mInv.m[3] + 2) = uStack_40;
  (pPVar4->super_LightBase).mediumInterface.inside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = uVar2;
  (pPVar4->super_LightBase).mediumInterface.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = uVar2;
  *(long *)(in_FS_OFFSET + -0x470) = *(long *)(in_FS_OFFSET + -0x470) + 1;
  pbrt::DenselySampledSpectrum::DenselySampledSpectrum
            (&pPVar4->I,(SpectrumHandle *)&local_c0,0x168,0x33e,alloc);
  pPVar4->scale = FVar1;
  return pPVar4;
}

Assistant:

T *new_object(Args &&... args) {
        // NOTE: this doesn't handle constructors that throw exceptions...
        T *p = allocate_object<T>();
        construct(p, std::forward<Args>(args)...);
        return p;
    }